

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bcatcstr(bstring b,char *s)

{
  uchar uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  undefined4 local_44;
  int local_3c;
  int l;
  int i;
  char *d;
  tagbstring t;
  char *s_local;
  bstring b_local;
  
  if ((((b == (bstring)0x0) || (b->data == (uchar *)0x0)) || (b->slen < 0)) ||
     (((b->mlen < b->slen || (b->mlen < 1)) || (s == (char *)0x0)))) {
    b_local._4_4_ = -1;
  }
  else {
    iVar2 = b->mlen;
    iVar3 = b->slen;
    _l = b->data + b->slen;
    t.data = (uchar *)s;
    for (local_3c = 0; local_3c < iVar2 - iVar3; local_3c = local_3c + 1) {
      uVar1 = *t.data;
      *_l = uVar1;
      if (uVar1 == '\0') {
        b->slen = local_3c + b->slen;
        return 0;
      }
      _l = _l + 1;
      t.data = t.data + 1;
    }
    b->slen = local_3c + b->slen;
    t._0_8_ = t.data;
    if (t.data == (uchar *)0x0) {
      local_44 = 0;
    }
    else {
      sVar4 = strlen((char *)t.data);
      local_44 = (undefined4)sVar4;
    }
    d._4_4_ = local_44;
    d._0_4_ = 0xffffffff;
    b_local._4_4_ = bconcat(b,(bstring)&d);
  }
  return b_local._4_4_;
}

Assistant:

int bcatcstr (bstring b, const char * s) {
struct tagbstring t;
char * d;
int i, l;

	if (b == NULL || b->data == NULL || b->slen < 0 || b->mlen < b->slen
	 || b->mlen <= 0 || s == NULL) return BSTR_ERR;

	/* Optimistically concatenate directly */
	l = b->mlen - b->slen;
	d = (char *) &b->data[b->slen];
	for (i=0; i < l; i++) {
		if ((*d++ = *s++) == '\0') {
			b->slen += i;
			return BSTR_OK;
		}
	}
	b->slen += i;

	/* Need to explicitely resize and concatenate tail */
	cstr2tbstr (t, s);
	return bconcat (b, &t);
}